

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::GetItemAccessors
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          uint32 index,Var *getter,Var *setter)

{
  Var pvVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  uint32 local_44;
  void *local_40;
  int i;
  IndexPropertyDescriptor *descriptor;
  
  local_44 = index;
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_44,
                     (IndexPropertyDescriptor **)&i,(int *)&local_40);
  uVar4 = 0;
  if ((bVar2) && ((_i->Attributes & 8) == 0)) {
    BVar3 = JavascriptArray::DirectGetItemAt<void*>(&arr->super_JavascriptArray,index,&local_40);
    uVar4 = 0;
    if (BVar3 == 0) {
      *getter = (_i->Getter).ptr;
      pvVar1 = (_i->Setter).ptr;
      *setter = pvVar1;
      uVar4 = 1;
      if ((_i->Getter).ptr == (void *)0x0) {
        uVar4 = (uint)(pvVar1 != (Var)0x0);
      }
    }
  }
  return uVar4;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetItemAccessors(ES5Array* arr, DynamicObject* instance, uint32 index, Var* getter, Var* setter)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (!HasDataItem(arr, index)) // if not shadowed by data item
            {
                *getter = descriptor->Getter;
                *setter = descriptor->Setter;
                return descriptor->Getter || descriptor->Setter;
            }
        }

        return false;
    }